

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void co_resume(stCoRoutine_t *co)

{
  int iVar1;
  stCoRoutineEnv_t *psVar2;
  stCoRoutine_t *curr;
  stCoRoutine_t *lpCurrRoutine;
  stCoRoutineEnv_t *env;
  stCoRoutine_t *co_local;
  
  psVar2 = co->env;
  curr = psVar2->pCallStack[psVar2->iCallStackSize + -1];
  if (co->cStart == '\0') {
    coctx_make(&co->ctx,CoRoutineFunc,co,(void *)0x0);
    co->cStart = '\x01';
  }
  iVar1 = psVar2->iCallStackSize;
  psVar2->iCallStackSize = iVar1 + 1;
  psVar2->pCallStack[iVar1] = co;
  co_swap(curr,co);
  return;
}

Assistant:

void co_resume( stCoRoutine_t *co )
{
	stCoRoutineEnv_t *env = co->env;
	stCoRoutine_t *lpCurrRoutine = env->pCallStack[ env->iCallStackSize - 1 ];
	if( !co->cStart )
	{
		coctx_make( &co->ctx,(coctx_pfn_t)CoRoutineFunc,co,0 );
		co->cStart = 1;
	}
	env->pCallStack[ env->iCallStackSize++ ] = co;
	co_swap( lpCurrRoutine, co );


}